

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FragDataIndexingCase::iterate(FragDataIndexingCase *this)

{
  undefined1 *puVar1;
  IndexExprType IVar2;
  RenderContext *renderCtx;
  code *pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  TextureFormat TVar10;
  void *__dest;
  long *plVar11;
  TextureFormat *pTVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TestError *this_00;
  size_type *psVar13;
  byte bVar14;
  char *description;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int height;
  uint uVar18;
  pointer *ppbVar19;
  uint uVar20;
  Surface result;
  deUint8 indices [6];
  size_type __dnew_1;
  float positions [8];
  float colors [16];
  float indexValues [4];
  ShaderProgram program;
  undefined1 local_318 [8];
  TextureFormat local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined4 local_2f0;
  Surface local_2e8;
  FragDataIndexingCase *local_2c8;
  undefined4 local_2c0;
  undefined2 local_2bc;
  TextureFormat local_2b8;
  long local_2b0;
  long local_2a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  long local_270;
  AttribLocationBinding local_268;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  long *local_228;
  long local_220;
  long local_218 [2];
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  PrimitiveType local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_178;
  pointer *local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  uint local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ShaderProgram local_100;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  local_270 = CONCAT44(extraout_var,iVar6);
  local_2c8 = this;
  memset(local_208,0,0xac);
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_140 = local_140 & 0xffffff00;
  local_298._M_dataplus._M_p = (pointer)0xf3;
  local_318 = (undefined1  [8])&local_308;
  TVar10 = (TextureFormat)std::__cxx11::string::_M_create((ulong *)local_318,(ulong)&local_298);
  _Var4._M_p = local_298._M_dataplus._M_p;
  local_308._M_allocated_capacity = (size_type)local_298._M_dataplus._M_p;
  local_318 = (undefined1  [8])TVar10;
  memcpy((void *)TVar10,
         "attribute highp vec4 a_position;\nattribute highp float a_index;\nattribute highp vec4 a_color;\nvarying mediump float v_index;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n\tv_index = a_index;\n}\n"
         ,0xf3);
  local_310 = (TextureFormat)_Var4._M_p;
  *(_Var4._M_p + (long)TVar10) = '\0';
  psVar13 = &local_268.name._M_string_length;
  local_268.name._M_dataplus._M_p = (pointer)((ulong)local_268.name._M_dataplus._M_p._4_4_ << 0x20);
  puVar1 = (undefined1 *)((long)&local_268.name.field_2 + 8);
  local_268.name._M_string_length = (size_type)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar13,local_318,_Var4._M_p + (long)local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + ((ulong)local_268.name._M_dataplus._M_p & 0xffffffff) * 0x18),
              (value_type *)psVar13);
  if ((undefined1 *)local_268.name._M_string_length != puVar1) {
    operator_delete((void *)local_268.name._M_string_length,local_268.name.field_2._8_8_ + 1);
  }
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  local_2e8._0_8_ = &local_2e8.m_pixels.m_cap;
  local_2b8.order = 0x7a;
  local_2b8.type = SNORM_INT8;
  __dest = (void *)std::__cxx11::string::_M_create((ulong *)&local_2e8,(ulong)&local_2b8);
  TVar10 = local_2b8;
  local_2e8.m_pixels.m_cap._0_4_ = local_2b8.order;
  local_2e8.m_pixels.m_cap._4_4_ = local_2b8.type;
  local_2e8._0_8_ = __dest;
  memcpy(__dest,
         "varying mediump vec4 v_color;\nvarying mediump float v_index;\nuniform mediump int u_index;\nvoid main (void)\n{\n\tgl_FragData["
         ,0x7a);
  local_2e8.m_pixels.m_ptr = (void *)TVar10;
  *(undefined1 *)((long)__dest + (long)TVar10) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  psVar13 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_298.field_2._M_allocated_capacity = *psVar13;
    local_298.field_2._8_8_ = plVar11[3];
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  }
  else {
    local_298.field_2._M_allocated_capacity = *psVar13;
    local_298._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_298._M_string_length = plVar11[1];
  *plVar11 = (long)psVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  pTVar12 = (TextureFormat *)std::__cxx11::string::append((char *)&local_298);
  TVar10 = (TextureFormat)(pTVar12 + 2);
  if (*pTVar12 == TVar10) {
    local_308._M_allocated_capacity = *(undefined8 *)TVar10;
    local_308._8_4_ = pTVar12[3].order;
    local_308._12_4_ = pTVar12[3].type;
    local_318 = (undefined1  [8])&local_308;
  }
  else {
    local_308._M_allocated_capacity = *(undefined8 *)TVar10;
    local_318 = (undefined1  [8])*pTVar12;
  }
  local_310 = pTVar12[1];
  *pTVar12 = TVar10;
  pTVar12[1].order = R;
  pTVar12[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar12[2].order = R;
  psVar13 = &local_268.name._M_string_length;
  local_268.name._M_dataplus._M_p._0_4_ = 1;
  local_268.name._M_string_length = (size_type)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar13,local_318,(long)local_310 + (long)local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + ((ulong)local_268.name._M_dataplus._M_p & 0xffffffff) * 0x18),
              (value_type *)psVar13);
  if ((undefined1 *)local_268.name._M_string_length != puVar1) {
    operator_delete((void *)local_268.name._M_string_length,local_268.name.field_2._8_8_ + 1);
  }
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((size_t *)local_2e8._0_8_ != &local_2e8.m_pixels.m_cap) {
    operator_delete((void *)local_2e8._0_8_,local_2e8.m_pixels.m_cap + 1);
  }
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_178);
  lVar16 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + lVar16));
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != -0x18);
  iVar6 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar6 = *(int *)CONCAT44(extraout_var_00,iVar6);
  if (0x7f < iVar6) {
    iVar6 = 0x80;
  }
  iVar7 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar7 = *(int *)(CONCAT44(extraout_var_01,iVar7) + 4);
  height = 0x80;
  if (iVar7 < 0x80) {
    height = iVar7;
  }
  local_298.field_2._M_allocated_capacity = 0x3f800000bf800000;
  local_298.field_2._8_8_ = 0x3f8000003f800000;
  local_298._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_298._M_string_length = 0xbf8000003f800000;
  local_238 = 0x3f80000000000000;
  uStack_230 = 0x3f80000000000000;
  local_268.location = 0;
  local_268._36_4_ = 0x3f800000;
  uStack_240 = 0x3f80000000000000;
  local_268.name.field_2._M_allocated_capacity = 0x3f80000000000000;
  local_268.name.field_2._8_8_ = 0x3f80000000000000;
  local_268.name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_268.name._M_string_length = 0x3f80000000000000;
  local_118 = 0;
  uStack_110 = 0;
  local_2bc = 0x301;
  local_2c0 = 0x2020100;
  local_2e8._0_8_ = &local_2e8.m_pixels.m_cap;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"a_position","");
  local_318._0_4_ = A;
  TVar10 = (TextureFormat)((long)local_308._M_local_buf + 8);
  local_310 = TVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_2e8._0_8_,(long)local_2e8.m_pixels.m_ptr + local_2e8._0_8_);
  local_2f0 = 0;
  local_208._0_4_ = local_318._0_4_;
  local_200._M_p = (pointer)&local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_310,
             (char *)(local_308._M_allocated_capacity + (long)local_310));
  local_1f0.field_2._M_allocated_capacity._0_4_ = local_2f0;
  local_1f0.field_2._8_4_ = 8;
  local_1f0.field_2._12_4_ = 0;
  iStack_1d0 = 2;
  iStack_1cc = 4;
  local_1c8 = 0;
  local_1c0 = &local_298;
  if (local_310 != TVar10) {
    operator_delete((void *)local_310,CONCAT44(local_308._12_4_,local_308._8_4_) + 1);
  }
  local_2b8 = (TextureFormat)local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"a_color","");
  local_318._0_4_ = A;
  local_310 = TVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_2b8,local_2b0 + (long)local_2b8);
  local_2f0 = 0;
  local_1b8 = local_318._0_4_;
  local_1b0[0] = &local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,local_310,
             (char *)(local_308._M_allocated_capacity + (long)local_310));
  local_1a0.field_2._M_allocated_capacity._0_4_ = local_2f0;
  local_1a0.field_2._8_4_ = 8;
  local_1a0.field_2._12_4_ = 0;
  uStack_180 = 4;
  uStack_17c = 4;
  local_178.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_178.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = &local_268;
  if (local_310 != TVar10) {
    operator_delete((void *)local_310,CONCAT44(local_308._12_4_,local_308._8_4_) + 1);
  }
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"a_index","");
  local_318._0_4_ = A;
  local_310 = TVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_228,local_220 + (long)local_228);
  local_2f0._0_1_ = false;
  local_2f0._1_3_ = 0;
  local_178.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_318._0_4_;
  ppbVar19 = &local_158.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_160 = ppbVar19;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_310,
             (char *)(local_308._M_allocated_capacity + (long)local_310));
  local_140 = local_2f0;
  local_138 = 8;
  uStack_130 = 0x400000001;
  local_128 = 0;
  local_120 = &local_118;
  if (local_310 != TVar10) {
    operator_delete((void *)local_310,CONCAT44(local_308._12_4_,local_308._8_4_) + 1);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  lVar16 = local_270;
  if (local_2b8 != (TextureFormat)local_2a8) {
    operator_delete((void *)local_2b8,local_2a8[0] + 1);
  }
  if ((size_t *)local_2e8._0_8_ != &local_2e8.m_pixels.m_cap) {
    operator_delete((void *)local_2e8._0_8_,local_2e8.m_pixels.m_cap + 1);
  }
  glu::operator<<(((local_2c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &local_100);
  if (local_100.m_program.m_info.linkOk != false) {
    (**(code **)(lVar16 + 0x1c0))(0x3f800000,0,0,0x3f800000);
    (**(code **)(lVar16 + 0x188))(0x4500);
    (**(code **)(lVar16 + 0x1a00))(0,0,iVar6,height);
    (**(code **)(lVar16 + 0x1680))(local_100.m_program.m_program);
    pcVar3 = *(code **)(lVar16 + 0x14f0);
    uVar8 = (**(code **)(lVar16 + 0xb48))(local_100.m_program.m_program,"u_index");
    (*pcVar3)(uVar8,0);
    local_318._0_4_ = R;
    local_318._4_4_ = UNORM_INT32;
    local_310 = (TextureFormat)((ulong)local_310 & 0xffffffff00000000);
    local_308._M_allocated_capacity = (size_type)&local_2c0;
    glu::draw(renderCtx,local_100.m_program.m_program,3,(VertexArrayBinding *)local_208,
              (PrimitiveList *)local_318,(DrawUtilCallback *)0x0);
    dVar9 = (**(code **)(lVar16 + 0x800))();
    glu::checkError(dVar9,"Rendering failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0xc5);
    tcu::Surface::Surface(&local_2e8,iVar6,height);
    iVar6 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
    lVar16 = CONCAT44(extraout_var_02,iVar6);
    bVar14 = 8 - *(char *)(lVar16 + 8);
    uVar18 = 0;
    if (0 < *(int *)(lVar16 + 0x14)) {
      uVar18 = 0x1000000 << (8U - (char)*(int *)(lVar16 + 0x14) & 0x1f);
    }
    uVar17 = 0x100 << (8U - *(char *)(lVar16 + 0xc) & 0x1f) | 1 << (bVar14 & 0x1f);
    uVar18 = 0x10000 << (8U - *(char *)(lVar16 + 0x10) & 0x1f) | uVar17 | uVar18;
    uVar15 = 1 << (bVar14 & 0x1f) & 0xff;
    if (0xfd < uVar15) {
      uVar15 = 0xfe;
    }
    uVar17 = uVar17 >> 8 & 0xff;
    if (0xfd < uVar17) {
      uVar17 = 0xfe;
    }
    uVar20 = uVar18 >> 0x10 & 0xff;
    if (0xfd < uVar20) {
      uVar20 = 0xfe;
    }
    uVar18 = uVar18 >> 0x18;
    if (0xfd < uVar18) {
      uVar18 = 0xfe;
    }
    local_2b8.order = RGBA;
    local_2b8.type = UNORM_INT8;
    TVar10 = (TextureFormat)local_2e8.m_pixels.m_cap;
    if ((TextureFormat)local_2e8.m_pixels.m_cap != (TextureFormat)0x0) {
      TVar10 = (TextureFormat)local_2e8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_318,&local_2b8,local_2e8.m_width,local_2e8.m_height,1,
               (void *)TVar10);
    glu::readPixels(renderCtx,0,0,(PixelBufferAccess *)local_318);
    dVar9 = (**(code **)(local_270 + 0x800))();
    glu::checkError(dVar9,"Reading pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0xcd);
    bVar5 = compareSingleColor(((local_2c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
                               ->m_log,&local_2e8,(RGBA)0xff00ff00,
                               (RGBA)(uVar18 * 0x1000000 + (uVar20 << 0x10 | uVar17 << 8 | uVar15) +
                                     0x1010101));
    description = "Image comparison failed";
    if (bVar5) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_2c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,
               description);
    tcu::Surface::~Surface(&local_2e8);
    lVar16 = -0xf0;
    do {
      if ((pointer)ppbVar19 != ppbVar19[-2]) {
        operator_delete(ppbVar19[-2],(ulong)((long)&((*ppbVar19)->_M_dataplus)._M_p + 1));
      }
      ppbVar19 = ppbVar19 + -10;
      lVar16 = lVar16 + 0x50;
    } while (lVar16 != 0);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    return STOP;
  }
  IVar2 = local_2c8->m_indexExprType;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  if (IVar2 == INDEX_EXPR_STATIC) {
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
               ,0xb7);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_318 = (undefined1  [8])&local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,"Dynamic indexing of gl_FragData[] not supported","");
  tcu::NotSupportedError::NotSupportedError((NotSupportedError *)this_00,(string *)local_318);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
		const glw::Functions&			gl				= renderCtx.getFunctions();
		const glu::ShaderProgram		program			(renderCtx, genSources(m_indexExprType));
		const int						viewportW		= de::min(renderCtx.getRenderTarget().getWidth(), 128);
		const int						viewportH		= de::min(renderCtx.getRenderTarget().getHeight(), 128);

		const float positions[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, +1.0f
		};
		const float colors[] =
		{
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f
		};
		const float		indexValues[]	= { 0.0f, 0.0f, 0.0f, 0.0f };
		const deUint8	indices[]		= { 0, 1, 2, 2, 1, 3 };

		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	2, 4, 0, &positions[0]),
			glu::va::Float("a_color",		4, 4, 0, &colors[0]),
			glu::va::Float("a_index",		1, 4, 0, &indexValues[0])
		};

		m_testCtx.getLog() << program;

		if (!program.isOk())
		{
			if (m_indexExprType == INDEX_EXPR_STATIC)
				TCU_FAIL("Compile failed");
			else
				throw tcu::NotSupportedError("Dynamic indexing of gl_FragData[] not supported");
		}

		gl.clearColor	(1.0f, 0.0f, 0.0f, 1.0f);
		gl.clear		(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		gl.viewport		(0, 0, viewportW, viewportH);
		gl.useProgram	(program.getProgram());
		gl.uniform1i	(gl.getUniformLocation(program.getProgram(), "u_index"), 0);

		glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

		{
			tcu::Surface		result		(viewportW, viewportH);
			const tcu::RGBA		threshold	= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
			bool				isOk;

			glu::readPixels(renderCtx, 0, 0, result.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

			isOk = compareSingleColor(m_testCtx.getLog(), result, tcu::RGBA::green(), threshold);

			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}